

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

void stbiw__encode_png_line
               (uchar *pixels,int stride_bytes,int width,int height,int y,int n,int filter_type,
               char *line_buffer)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  uchar uVar4;
  int local_68;
  int local_64;
  int *local_50;
  int signed_stride;
  uchar *z;
  int type;
  int i;
  int *mymap;
  int n_local;
  int y_local;
  int height_local;
  int width_local;
  int stride_bytes_local;
  uchar *pixels_local;
  
  if (y == 0) {
    local_50 = stbiw__encode_png_line::firstmap;
  }
  else {
    local_50 = stbiw__encode_png_line::mapping;
  }
  iVar2 = local_50[filter_type];
  local_64 = y;
  if (stbi__flip_vertically_on_write != 0) {
    local_64 = (height + -1) - y;
  }
  local_64 = stride_bytes * local_64;
  local_68 = stride_bytes;
  if (stbi__flip_vertically_on_write != 0) {
    local_68 = -stride_bytes;
  }
  for (z._4_4_ = 0; iVar3 = n, z._4_4_ < n; z._4_4_ = z._4_4_ + 1) {
    switch(iVar2) {
    case 0:
      line_buffer[z._4_4_] = pixels[(long)z._4_4_ + (long)local_64];
      break;
    case 1:
      line_buffer[z._4_4_] = pixels[(long)z._4_4_ + (long)local_64];
      break;
    case 2:
      line_buffer[z._4_4_] =
           pixels[(long)z._4_4_ + (long)local_64] -
           pixels[(long)(z._4_4_ - local_68) + (long)local_64];
      break;
    case 3:
      line_buffer[z._4_4_] =
           pixels[(long)z._4_4_ + (long)local_64] -
           (char)((int)(uint)pixels[(long)(z._4_4_ - local_68) + (long)local_64] >> 1);
      break;
    case 4:
      uVar1 = pixels[(long)z._4_4_ + (long)local_64];
      uVar4 = stbiw__paeth(0,(uint)pixels[(long)(z._4_4_ - local_68) + (long)local_64],0);
      line_buffer[z._4_4_] = uVar1 - uVar4;
      break;
    case 5:
      line_buffer[z._4_4_] = pixels[(long)z._4_4_ + (long)local_64];
      break;
    case 6:
      line_buffer[z._4_4_] = pixels[(long)z._4_4_ + (long)local_64];
    }
  }
  while (z._4_4_ = iVar3, z._4_4_ < width * n) {
    switch(iVar2) {
    case 0:
      line_buffer[z._4_4_] = pixels[(long)z._4_4_ + (long)local_64];
      break;
    case 1:
      line_buffer[z._4_4_] =
           pixels[(long)z._4_4_ + (long)local_64] - pixels[(long)(z._4_4_ - n) + (long)local_64];
      break;
    case 2:
      line_buffer[z._4_4_] =
           pixels[(long)z._4_4_ + (long)local_64] -
           pixels[(long)(z._4_4_ - local_68) + (long)local_64];
      break;
    case 3:
      line_buffer[z._4_4_] =
           pixels[(long)z._4_4_ + (long)local_64] -
           (char)((int)((uint)pixels[(long)(z._4_4_ - n) + (long)local_64] +
                       (uint)pixels[(long)(z._4_4_ - local_68) + (long)local_64]) >> 1);
      break;
    case 4:
      uVar1 = pixels[(long)z._4_4_ + (long)local_64];
      uVar4 = stbiw__paeth((uint)pixels[(long)(z._4_4_ - n) + (long)local_64],
                           (uint)pixels[(long)(z._4_4_ - local_68) + (long)local_64],
                           (uint)pixels[(long)((z._4_4_ - local_68) - n) + (long)local_64]);
      line_buffer[z._4_4_] = uVar1 - uVar4;
      break;
    case 5:
      line_buffer[z._4_4_] =
           pixels[(long)z._4_4_ + (long)local_64] -
           (char)((int)(uint)pixels[(long)(z._4_4_ - n) + (long)local_64] >> 1);
      break;
    case 6:
      uVar1 = pixels[(long)z._4_4_ + (long)local_64];
      uVar4 = stbiw__paeth((uint)pixels[(long)(z._4_4_ - n) + (long)local_64],0,0);
      line_buffer[z._4_4_] = uVar1 - uVar4;
    }
    iVar3 = z._4_4_ + 1;
  }
  return;
}

Assistant:

static void stbiw__encode_png_line(unsigned char *pixels, int stride_bytes,
                                   int width, int height, int y, int n,
                                   int filter_type, signed char *line_buffer) {
  static int mapping[] = {0, 1, 2, 3, 4};
  static int firstmap[] = {0, 1, 0, 5, 6};
  int *mymap = (y != 0) ? mapping : firstmap;
  int i;
  int type = mymap[filter_type];
  unsigned char *z =
      pixels +
      stride_bytes * (stbi__flip_vertically_on_write ? height - 1 - y : y);
  int signed_stride =
      stbi__flip_vertically_on_write ? -stride_bytes : stride_bytes;
  for (i = 0; i < n; ++i) {
    switch (type) {
      case 0:
        line_buffer[i] = z[i];
        break;
      case 1:
        line_buffer[i] = z[i];
        break;
      case 2:
        line_buffer[i] = z[i] - z[i - signed_stride];
        break;
      case 3:
        line_buffer[i] = z[i] - (z[i - signed_stride] >> 1);
        break;
      case 4:
        line_buffer[i] =
            (signed char)(z[i] - stbiw__paeth(0, z[i - signed_stride], 0));
        break;
      case 5:
        line_buffer[i] = z[i];
        break;
      case 6:
        line_buffer[i] = z[i];
        break;
    }
  }
  for (i = n; i < width * n; ++i) {
    switch (type) {
      case 0:
        line_buffer[i] = z[i];
        break;
      case 1:
        line_buffer[i] = z[i] - z[i - n];
        break;
      case 2:
        line_buffer[i] = z[i] - z[i - signed_stride];
        break;
      case 3:
        line_buffer[i] = z[i] - ((z[i - n] + z[i - signed_stride]) >> 1);
        break;
      case 4:
        line_buffer[i] = z[i] - stbiw__paeth(z[i - n], z[i - signed_stride],
                                             z[i - signed_stride - n]);
        break;
      case 5:
        line_buffer[i] = z[i] - (z[i - n] >> 1);
        break;
      case 6:
        line_buffer[i] = z[i] - stbiw__paeth(z[i - n], 0, 0);
        break;
    }
  }
}